

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutosvg.c
# Opt level: O2

_Bool parse_color_value(char **begin,char *end,color_t *color)

{
  _Bool _Var1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  plutovg_color_t value;
  char *local_40;
  plutovg_color_t local_38;
  
  local_40 = *begin;
  _Var1 = skip_string(&local_40,end,"currentColor");
  pcVar4 = local_40;
  if (_Var1) {
    color->type = color_type_current;
    color->value = 0xff000000;
  }
  else {
    iVar2 = plutovg_color_parse(&local_38,local_40,(int)end - (int)local_40);
    if (iVar2 == 0) {
      return false;
    }
    color->type = color_type_fixed;
    uVar3 = plutovg_color_to_argb32(&local_38);
    color->value = uVar3;
    pcVar4 = pcVar4 + iVar2;
  }
  *begin = pcVar4;
  skip_ws(begin,end);
  return true;
}

Assistant:

static bool parse_color_value(const char** begin, const char* end, color_t* color)
{
    const char* it = *begin;
    if(skip_string(&it, end, "currentColor")) {
        color->type = color_type_current;
        color->value = 0xFF000000;
    } else {
        plutovg_color_t value;
        int length = plutovg_color_parse(&value, it, end - it);
        if(length == 0)
            return false;
        color->type = color_type_fixed;
        color->value = plutovg_color_to_argb32(&value);
        it += length;
    }

    *begin = it;
    skip_ws(begin, end);
    return true;
}